

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(MinimalityCheck *this,FwdCheck *afwd)

{
  FwdCheck FVar1;
  uint uVar2;
  
  FVar1 = *afwd;
  this->fwd = FVar1;
  this->high = 0xffffffff;
  this->low = 0;
  this->next = 0;
  this->scc = 0;
  uVar2 = FVar1._0_4_;
  if (0x64000000 < (uVar2 & 0x7f000000)) {
    *(uint *)&this->fwd = uVar2 & 0x80ffffff | 0x64000000;
  }
  if ((*(uint *)&this->fwd & 0xffffff) == 0) {
    *(uint *)&this->fwd = *(uint *)&this->fwd | 0xffffff;
  }
  this->high = *(uint *)&this->fwd & 0xffffff;
  return;
}

Assistant:

DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(const FwdCheck& afwd) : fwd(afwd), high(UINT32_MAX), low(0), next(0), scc(0) {
	if (fwd.highPct > 100) { fwd.highPct  = 100; }
	if (fwd.highStep == 0) { fwd.highStep = ~fwd.highStep; }
	high = fwd.highStep;
}